

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  uint idx;
  undefined1 auVar1 [16];
  int iVar2;
  JSValueUnion *pJVar3;
  ulong uVar4;
  uint32_t *pres;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  int64_t iVar7;
  JSValue v;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  ulong uStack_80;
  JSValueUnion local_70;
  uint32_t local_5c;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  pJVar3 = (JSValueUnion *)JS_GetOpaque2(ctx,this_val,0x25);
  if (pJVar3 == (JSValueUnion *)0x0) goto LAB_001338cc;
  if (pJVar3[1].int32 == 3) {
LAB_00133881:
    *pdone = 1;
    uStack_80 = 3;
  }
  else {
    JVar6 = (JSValueUnion)pJVar3->ptr;
    if ((ushort)(*(short *)((long)JVar6.ptr + 6) - 0x15U) < 9) {
      if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar6.ptr + 0x30) + 0x18) + 0x30) + 4) !=
          '\0') {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto LAB_001338cc;
      }
      pres = (uint32_t *)((long)JVar6.ptr + 0x40);
LAB_001338f8:
      idx = *(uint *)((long)pJVar3 + 0x14);
      JVar6._4_4_ = 0;
      JVar6.int32 = idx;
      if (*pres <= idx) {
        JS_FreeValue(ctx,*(JSValue *)pJVar3);
        pJVar3->int32 = 0;
        pJVar3[1].float64 = 1.48219693752374e-323;
        goto LAB_00133881;
      }
      *(uint *)((long)pJVar3 + 0x14) = idx + 1;
      *pdone = 0;
      if (pJVar3[2].int32 == 0) {
        JVar5.float64 = (double)JVar6.float64;
        if (-1 < (int)idx) {
          JVar5 = JVar6;
        }
        iVar7 = 7;
        if (-1 < (int)idx) {
          iVar7 = 0;
        }
        JVar10.tag = iVar7;
        JVar10.u.float64 = JVar5.float64;
        uVar4 = (ulong)JVar5.ptr & 0x7fffffff00000000;
        goto LAB_001338d9;
      }
      JVar9 = JS_GetPropertyUint32(ctx,*(JSValue *)pJVar3,idx);
      if ((int)JVar9.tag != 6) {
        if (pJVar3[2].int32 == 1) {
          uVar4 = (ulong)JVar9.u.ptr & 0xffffffff00000000;
          JVar10 = JVar9;
        }
        else {
          JVar5.float64 = (double)JVar6.float64;
          if (-1 < (int)idx) {
            JVar5 = JVar6;
          }
          iVar7 = 7;
          if (-1 < (int)idx) {
            iVar7 = 0;
          }
          local_58 = JVar5;
          local_50 = iVar7;
          local_48 = JVar9;
          JVar10 = js_create_array(ctx,2,(JSValue *)&local_58);
          JS_FreeValue(ctx,JVar9);
          v.tag = iVar7;
          v.u.float64 = JVar5.float64;
          JS_FreeValue(ctx,v);
          local_70 = JVar10.u;
          uVar4 = (ulong)local_70.ptr & 0xffffffff00000000;
        }
        goto LAB_001338d9;
      }
    }
    else {
      pres = &local_5c;
      JVar9.tag = (int64_t)pJVar3[1].ptr;
      JVar9.u = (JSValueUnion)(JSValueUnion)JVar6.ptr;
      iVar2 = js_get_length32(ctx,pres,JVar9);
      if (iVar2 == 0) goto LAB_001338f8;
LAB_001338cc:
      *pdone = 0;
    }
    uStack_80 = 6;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_80;
  uVar4 = 0;
  JVar10 = (JSValue)(auVar1 << 0x40);
LAB_001338d9:
  JVar8.u.ptr = (void *)((ulong)JVar10.u.ptr & 0xffffffff | uVar4);
  JVar8.tag = JVar10.tag;
  return JVar8;
}

Assistant:

static JSValue js_array_iterator_next(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv,
                                      BOOL *pdone, int magic)
{
    JSArrayIteratorData *it;
    uint32_t len, idx;
    JSValue val, obj;
    JSObject *p;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_ARRAY_ITERATOR);
    if (!it)
        goto fail1;
    if (JS_IsUndefined(it->obj))
        goto done;
    p = JS_VALUE_GET_OBJ(it->obj);
    if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
        p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
        if (typed_array_is_detached(ctx, p)) {
            JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
            goto fail1;
        }
        len = p->u.array.count;
    } else {
        if (js_get_length32(ctx, &len, it->obj)) {
        fail1:
            *pdone = FALSE;
            return JS_EXCEPTION;
        }
    }
    idx = it->idx;
    if (idx >= len) {
        JS_FreeValue(ctx, it->obj);
        it->obj = JS_UNDEFINED;
    done:
        *pdone = TRUE;
        return JS_UNDEFINED;
    }
    it->idx = idx + 1;
    *pdone = FALSE;
    if (it->kind == JS_ITERATOR_KIND_KEY) {
        return JS_NewUint32(ctx, idx);
    } else {
        val = JS_GetPropertyUint32(ctx, it->obj, idx);
        if (JS_IsException(val))
            return JS_EXCEPTION;
        if (it->kind == JS_ITERATOR_KIND_VALUE) {
            return val;
        } else {
            JSValueConst args[2];
            JSValue num;
            num = JS_NewUint32(ctx, idx);
            args[0] = num;
            args[1] = val;
            obj = js_create_array(ctx, 2, args);
            JS_FreeValue(ctx, val);
            JS_FreeValue(ctx, num);
            return obj;
        }
    }
}